

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet,Expr *p)

{
  uint uVar1;
  ExprList *pEVar2;
  Bitmask BVar3;
  ulong uVar4;
  ulong uVar5;
  Window *pWVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ExprList_item *pEVar10;
  ulong uVar11;
  
  uVar1 = p->flags;
  if (p->op == 0xa2) {
    if ((uVar1 & 8) == 0) {
      if ((long)pMaskSet->n < 1) {
        return 0;
      }
      lVar9 = 0;
      do {
        if (pMaskSet->ix[lVar9] == p->iTable) {
          return 1L << ((byte)lVar9 & 0x3f);
        }
        lVar9 = lVar9 + 1;
      } while (pMaskSet->n != lVar9);
      return 0;
    }
    uVar11 = 0;
    if ((uVar1 & 0x804000) != 0) {
      return 0;
    }
  }
  else {
    if ((uVar1 & 0x804000) != 0) {
      return 0;
    }
    if ((p->op == 0xab) && (0 < (long)pMaskSet->n)) {
      uVar11 = 0;
      lVar9 = 0;
      do {
        if (pMaskSet->ix[lVar9] == p->iTable) {
          uVar11 = 1L << ((byte)lVar9 & 0x3f);
          break;
        }
        lVar9 = lVar9 + 1;
      } while (pMaskSet->n != lVar9);
    }
    else {
      uVar11 = 0;
    }
  }
  if (p->pLeft != (Expr *)0x0) {
    BVar3 = sqlite3WhereExprUsageNN(pMaskSet,p->pLeft);
    uVar11 = uVar11 | BVar3;
  }
  if (p->pRight == (Expr *)0x0) {
    if ((p->flags >> 0xb & 1) == 0) {
      pEVar2 = (p->x).pList;
      if (pEVar2 != (ExprList *)0x0) {
        iVar8 = pEVar2->nExpr;
        if (iVar8 < 1) {
          uVar4 = 0;
        }
        else {
          pEVar10 = pEVar2->a;
          lVar9 = 0;
          uVar4 = 0;
          do {
            if (pEVar10->pExpr == (Expr *)0x0) {
              uVar5 = 0;
            }
            else {
              uVar5 = sqlite3WhereExprUsageNN(pMaskSet,pEVar10->pExpr);
              iVar8 = pEVar2->nExpr;
            }
            uVar4 = uVar4 | uVar5;
            lVar9 = lVar9 + 1;
            pEVar10 = pEVar10 + 1;
          } while (lVar9 < iVar8);
        }
        uVar11 = uVar11 | uVar4;
      }
      goto LAB_00184513;
    }
    if ((p->flags & 0x20) != 0) {
      pMaskSet->bVarSelect = 1;
    }
    uVar4 = exprSelectUsage(pMaskSet,(p->x).pSelect);
  }
  else {
    uVar4 = sqlite3WhereExprUsageNN(pMaskSet,p->pRight);
  }
  uVar11 = uVar11 | uVar4;
LAB_00184513:
  if (p->op != 0xa1) {
    return uVar11;
  }
  pWVar6 = (p->y).pWin;
  if (pWVar6 != (Window *)0x0) {
    pEVar2 = pWVar6->pPartition;
    if ((pEVar2 == (ExprList *)0x0) || (iVar8 = pEVar2->nExpr, iVar8 < 1)) {
      uVar4 = 0;
    }
    else {
      pEVar10 = pEVar2->a;
      lVar9 = 0;
      uVar4 = 0;
      do {
        if (pEVar10->pExpr == (Expr *)0x0) {
          uVar5 = 0;
        }
        else {
          uVar5 = sqlite3WhereExprUsageNN(pMaskSet,pEVar10->pExpr);
          iVar8 = pEVar2->nExpr;
        }
        uVar4 = uVar4 | uVar5;
        lVar9 = lVar9 + 1;
        pEVar10 = pEVar10 + 1;
      } while (lVar9 < iVar8);
      pWVar6 = (p->y).pWin;
    }
    pEVar2 = pWVar6->pOrderBy;
    if ((pEVar2 == (ExprList *)0x0) || (iVar8 = pEVar2->nExpr, iVar8 < 1)) {
      uVar5 = 0;
    }
    else {
      pEVar10 = pEVar2->a;
      lVar9 = 0;
      uVar5 = 0;
      do {
        if (pEVar10->pExpr == (Expr *)0x0) {
          uVar7 = 0;
        }
        else {
          uVar7 = sqlite3WhereExprUsageNN(pMaskSet,pEVar10->pExpr);
          iVar8 = pEVar2->nExpr;
        }
        uVar5 = uVar5 | uVar7;
        lVar9 = lVar9 + 1;
        pEVar10 = pEVar10 + 1;
      } while (lVar9 < iVar8);
    }
    return uVar4 | uVar11 | uVar5;
  }
  return uVar11;
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet, Expr *p){
  Bitmask mask;
  if( p->op==TK_COLUMN && !ExprHasProperty(p, EP_FixedCol) ){
    return sqlite3WhereGetMask(pMaskSet, p->iTable);
  }else if( ExprHasProperty(p, EP_TokenOnly|EP_Leaf) ){
    assert( p->op!=TK_IF_NULL_ROW );
    return 0;
  }
  mask = (p->op==TK_IF_NULL_ROW) ? sqlite3WhereGetMask(pMaskSet, p->iTable) : 0;
  if( p->pLeft ) mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pLeft);
  if( p->pRight ){
    mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pRight);
    assert( p->x.pList==0 );
  }else if( ExprHasProperty(p, EP_xIsSelect) ){
    if( ExprHasProperty(p, EP_VarSelect) ) pMaskSet->bVarSelect = 1;
    mask |= exprSelectUsage(pMaskSet, p->x.pSelect);
  }else if( p->x.pList ){
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->x.pList);
  }
#ifndef SQLITE_OMIT_WINDOWFUNC
  if( p->op==TK_FUNCTION && p->y.pWin ){
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->y.pWin->pPartition);
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->y.pWin->pOrderBy);
  }
#endif
  return mask;
}